

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O3

boolean dig_check(monst *madeby,boolean verbose,int x,int y)

{
  boolean bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  trap *ptVar5;
  obj *poVar6;
  char *pcVar7;
  char *pcVar8;
  
  ptVar5 = t_at(level,x,y);
  pcVar8 = "dig in";
  if (((uwep != (obj *)0x0 && madeby == &youmonst) && ((byte)(uwep->oclass | 4U) == 6)) &&
     (pcVar8 = "dig in", objects[uwep->otyp].oc_subtyp == '\x03')) {
    pcVar8 = "chop";
  }
  bVar1 = On_stairs((xchar)x,(xchar)y);
  if (bVar1 == '\0') {
    cVar2 = level->locations[x][y].typ;
    if (cVar2 == '\x17') {
      iVar4 = artifact_door(level,x,y);
      if (iVar4 != 0) {
        if (verbose == '\0') {
          return '\0';
        }
        pcVar8 = surface(x,y);
        pcVar7 = "The %s here is too hard to dig in.";
        goto LAB_001644ba;
      }
      cVar2 = level->locations[x][y].typ;
    }
    if ((madeby == (monst *)0x0) || (cVar2 != '\x1d')) {
      if ((cVar2 == '!') &&
         (((madeby != (monst *)0x0 ||
           (bVar1 = on_level(&u.uz,&dungeon_topology.d_astral_level), bVar1 != '\0')) ||
          (bVar1 = on_level(&u.uz,&dungeon_topology.d_sanctum_level), bVar1 != '\0')))) {
        if (verbose != '\0') {
          pcVar8 = "The altar is too hard to break apart.";
          goto LAB_001644ed;
        }
      }
      else {
        bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
        if (bVar1 == '\0') {
          bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
          if (bVar1 == '\0') {
            cVar2 = level->locations[x][y].typ;
            if (((cVar2 == '\x0f' || '\x10' < cVar2) ||
                ((level->locations[x][y].field_0x6 & 0x80) == 0)) &&
               ((ptVar5 == (trap *)0x0 ||
                (((bVar3 = ptVar5->field_0x8 & 0x1f, bVar3 != 0xf && (bVar3 != 0x12)) &&
                 (bVar1 = can_dig_down(level), bVar1 != '\0')))))) {
              poVar6 = sobj_at(0x214,level,x,y);
              if (poVar6 == (obj *)0x0) {
                if ((madeby != (monst *)0x0) ||
                   (((ptVar5 == (trap *)0x0 && (bVar1 = is_pool(level,x,y), bVar1 == '\0')) &&
                    (bVar1 = is_lava(level,x,y), bVar1 == '\0')))) {
                  return '\x01';
                }
              }
              else if (verbose != '\0') {
                pcVar7 = "There isn\'t enough room to %s here.";
                goto LAB_001644ba;
              }
            }
            else if (verbose != '\0') {
              pcVar7 = surface(x,y);
              pline("The %s here is too hard to %s.",pcVar7,pcVar8);
              return '\0';
            }
          }
          else if (verbose != '\0') {
            pcVar8 = "The water splashes and subsides.";
            goto LAB_001644ed;
          }
        }
        else if (verbose != '\0') {
          pcVar7 = "You cannot %s thin air.";
LAB_001644ba:
          pline(pcVar7,pcVar8);
          return '\0';
        }
      }
    }
    else if (verbose != '\0') {
      pcVar8 = "The throne is too hard to break apart.";
LAB_001644ed:
      pline(pcVar8);
      return '\0';
    }
  }
  else if (((level->dnladder).sx == x) || ((level->upladder).sx == x)) {
    if (verbose != '\0') {
      pcVar8 = "The ladder resists your effort.";
      goto LAB_001644ed;
    }
  }
  else if (verbose != '\0') {
    pcVar7 = "The stairs are too hard to %s.";
    goto LAB_001644ba;
  }
  return '\0';
}

Assistant:

boolean dig_check(struct monst *madeby, boolean verbose, int x, int y)
{
	struct trap *ttmp = t_at(level, x, y);
	const char *verb = (madeby == BY_YOU && uwep && is_axe(uwep)) ? "chop" : "dig in";

	if (On_stairs(x, y)) {
	    if (x == level->dnladder.sx || x == level->upladder.sx) {
		if (verbose) pline("The ladder resists your effort.");
	    } else if (verbose) pline("The stairs are too hard to %s.", verb);
	    return FALSE;
	/* ALI - Artifact doors */
	} else if (IS_DOOR(level->locations[x][y].typ) && artifact_door(level, x, y)) {
	    if (verbose) pline("The %s here is too hard to dig in.", surface(x,y));
	    return FALSE;
	} else if (IS_THRONE(level->locations[x][y].typ) && madeby != BY_OBJECT) {
	    if (verbose) pline("The throne is too hard to break apart.");
	    return FALSE;
	} else if (IS_ALTAR(level->locations[x][y].typ) && (madeby != BY_OBJECT ||
				Is_astralevel(&u.uz) || Is_sanctum(&u.uz))) {
	    if (verbose) pline("The altar is too hard to break apart.");
	    return FALSE;
	} else if (Is_airlevel(&u.uz)) {
	    if (verbose) pline("You cannot %s thin air.", verb);
	    return FALSE;
	} else if (Is_waterlevel(&u.uz)) {
	    if (verbose) pline("The water splashes and subsides.");
	    return FALSE;
	} else if ((IS_ROCK(level->locations[x][y].typ) && level->locations[x][y].typ != SDOOR &&
		      (level->locations[x][y].wall_info & W_NONDIGGABLE) != 0)
		|| (ttmp &&
		      (ttmp->ttyp == MAGIC_PORTAL ||
                       ttmp->ttyp == VIBRATING_SQUARE ||
                       !can_dig_down(level)))) {
	    if (verbose) pline("The %s here is too hard to %s.",
				  surface(x,y), verb);
	    return FALSE;
	} else if (sobj_at(BOULDER, level, x, y)) {
	    if (verbose) pline("There isn't enough room to %s here.", verb);
	    return FALSE;
	} else if (madeby == BY_OBJECT &&
		    /* the block against existing traps is mainly to
		       prevent broken wands from turning holes into pits */
		    (ttmp || is_pool(level, x,y) || is_lava(level, x,y))) {
	    /* digging by player handles pools separately */
	    return FALSE;
	}
	return TRUE;
}